

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

int read_features_json<true>(vw *all,v_array<example_*> *examples)

{
  bool bVar1;
  size_t sVar2;
  size_t num_chars;
  char *line;
  
  do {
    sVar2 = read_features(all,&line,&num_chars);
    if (sVar2 == 0) {
      return 0;
    }
    line[num_chars] = '\0';
    bVar1 = parse_line_json<true>(all,line,num_chars,examples);
  } while (!bVar1);
  prepare_for_learner(all,examples);
  return 1;
}

Assistant:

int read_features_json(vw* all, v_array<example*>& examples)
{
  // Keep reading lines until a valid set of examples is produced.
  bool reread;
  do
  {
    reread = false;

    char* line;
    size_t num_chars;
    size_t num_chars_initial = read_features(all, line, num_chars);
    if (num_chars_initial < 1)
      return (int)num_chars_initial;

    // Ensure there is a null terminator.
    line[num_chars] = '\0';

    reread = !parse_line_json<audit>(all, line, num_chars, examples);
  } while (reread);

  prepare_for_learner(all, examples);

  return 1;
}